

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEditPrivate::updateDefaultTextOption(QPlainTextEditPrivate *this)

{
  WrapMode WVar1;
  WrapMode WVar2;
  QTextDocument *pQVar3;
  QWidgetTextControl *in_RDI;
  long in_FS_OFFSET;
  WrapMode oldWrapMode;
  QTextDocument *doc;
  QTextOption opt;
  undefined1 *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidgetTextControl::document(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = 0xffffffffffffffff;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultTextOption();
  WVar1 = QTextOption::wrapMode((QTextOption *)&local_20);
  if (*(int *)&in_RDI[0x22].field_0x8 == 0) {
    QTextOption::setWrapMode((QTextOption *)&local_20,NoWrap);
  }
  else {
    QTextOption::setWrapMode((QTextOption *)&local_20,*(WrapMode *)&in_RDI[0x22].field_0xc);
  }
  WVar2 = QTextOption::wrapMode((QTextOption *)&local_20);
  if (WVar2 != WVar1) {
    QTextDocument::setDefaultTextOption((QTextOption *)pQVar3);
  }
  QTextOption::~QTextOption((QTextOption *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::updateDefaultTextOption()
{
    QTextDocument *doc = control->document();

    QTextOption opt = doc->defaultTextOption();
    QTextOption::WrapMode oldWrapMode = opt.wrapMode();

    if (lineWrap == QPlainTextEdit::NoWrap)
        opt.setWrapMode(QTextOption::NoWrap);
    else
        opt.setWrapMode(wordWrap);

    if (opt.wrapMode() != oldWrapMode)
        doc->setDefaultTextOption(opt);
}